

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_verify_tally
              (secp256k1_context *ctx,secp256k1_pedersen_commitment **pos,size_t n_pos,
              secp256k1_pedersen_commitment **neg,size_t n_neg)

{
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  secp256k1_gej *in_R8;
  size_t i;
  secp256k1_ge add;
  secp256k1_gej accj;
  undefined6 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 uVar1;
  undefined1 uVar2;
  secp256k1_callback *in_stack_fffffffffffffef0;
  secp256k1_gej *r;
  ulong uVar3;
  secp256k1_pedersen_commitment *in_stack_ffffffffffffff08;
  secp256k1_ge *in_stack_ffffffffffffff10;
  secp256k1_gej local_b0;
  secp256k1_gej *local_30;
  ulong local_20;
  int local_4;
  
  uVar2 = in_RDX == 0 || in_RSI != 0;
  if (in_RDX == 0 || in_RSI != 0) {
    uVar1 = in_R8 == (secp256k1_gej *)0x0 || in_RCX != 0;
    if (in_R8 == (secp256k1_gej *)0x0 || in_RCX != 0) {
      local_30 = in_R8;
      local_20 = in_RDX;
      secp256k1_gej_set_infinity((secp256k1_gej *)0x10c93f);
      for (r = (secp256k1_gej *)0x0; r < local_30; r = (secp256k1_gej *)((long)(r->x).n + 1)) {
        secp256k1_pedersen_commitment_load(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)accj.y.n[4],(secp256k1_gej *)accj.y.n[3],
                   (secp256k1_ge *)accj.y.n[2],(secp256k1_fe *)accj.y.n[1]);
      }
      secp256k1_gej_neg(r,(secp256k1_gej *)CONCAT17(uVar2,CONCAT16(uVar1,in_stack_fffffffffffffee8))
                       );
      for (uVar3 = 0; uVar3 < local_20; uVar3 = uVar3 + 1) {
        secp256k1_pedersen_commitment_load(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        secp256k1_gej_add_ge_var
                  ((secp256k1_gej *)accj.y.n[4],(secp256k1_gej *)accj.y.n[3],
                   (secp256k1_ge *)accj.y.n[2],(secp256k1_fe *)accj.y.n[1]);
      }
      local_4 = secp256k1_gej_is_infinity(&local_b0);
    }
    else {
      secp256k1_callback_call
                (in_stack_fffffffffffffef0,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar1,in_stack_fffffffffffffee8)));
      local_4 = 0;
    }
  }
  else {
    secp256k1_callback_call
              (in_stack_fffffffffffffef0,
               (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8))
              );
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int secp256k1_pedersen_verify_tally(const secp256k1_context* ctx, const secp256k1_pedersen_commitment * const* pos, size_t n_pos, const secp256k1_pedersen_commitment * const* neg, size_t n_neg) {
    secp256k1_gej accj;
    secp256k1_ge add;
    size_t i;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(!n_pos || (pos != NULL));
    ARG_CHECK(!n_neg || (neg != NULL));
    (void) ctx;
    secp256k1_gej_set_infinity(&accj);
    for (i = 0; i < n_neg; i++) {
        secp256k1_pedersen_commitment_load(&add, neg[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    secp256k1_gej_neg(&accj, &accj);
    for (i = 0; i < n_pos; i++) {
        secp256k1_pedersen_commitment_load(&add, pos[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    return secp256k1_gej_is_infinity(&accj);
}